

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_callback(nk_context *ctx,_func_void_void_ptr_int_char_ptr_ptr *item_getter,
                     void *userdata,int selected,int count,int item_height,nk_vec2 size)

{
  undefined8 uVar1;
  int iVar2;
  nk_bool nVar3;
  int in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  nk_vec2 ctx_00;
  char *item;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int max_height;
  int i;
  int in_stack_ffffffffffffff98;
  nk_context *in_stack_ffffffffffffffa8;
  nk_vec2 size_00;
  float fStack_44;
  int local_38;
  int local_2c;
  float fStack_8;
  int local_4;
  
  local_4 = in_ECX;
  if ((in_RDI != 0) && (in_RSI != (code *)0x0)) {
    uVar1 = *(undefined8 *)(in_RDI + 0x1e8c);
    ctx_00 = nk_panel_get_padding
                       ((nk_style *)(in_RDI + 0x168),
                        **(nk_panel_type **)(*(long *)(in_RDI + 0x40d8) + 0xa8));
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    iVar2 = (int)fStack_44 * 2 + (int)ctx_00.y * 2 + in_R8D * in_R9D + in_R8D * (int)fStack_44;
    fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
    if ((float)iVar2 <= fStack_8) {
      fStack_8 = (float)iVar2;
    }
    size_00 = ctx_00;
    (*in_RSI)(in_RDX,in_ECX,&stack0xffffffffffffffa8);
    nVar3 = nk_combo_begin_label(in_stack_ffffffffffffffa8,(char *)ctx_00,size_00);
    local_2c = in_ECX;
    if (nVar3 != 0) {
      nk_layout_row_dynamic((nk_context *)ctx_00,fStack_8,in_stack_ffffffffffffff98);
      for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
        (*in_RSI)(in_RDX,local_38,&stack0xffffffffffffffa8);
        nVar3 = nk_combo_item_label((nk_context *)ctx_00,
                                    (char *)CONCAT44(fStack_8,in_stack_ffffffffffffff98),0);
        if (nVar3 != 0) {
          local_2c = local_38;
        }
      }
      nk_combo_end((nk_context *)0x14527b);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_callback(struct nk_context *ctx, void(*item_getter)(void*, int, const char**),
void *userdata, int selected, int count, int item_height, struct nk_vec2 size)
{
int i;
int max_height;
struct nk_vec2 item_spacing;
struct nk_vec2 window_padding;
const char *item;

NK_ASSERT(ctx);
NK_ASSERT(item_getter);
if (!ctx || !item_getter)
return selected;

/* calculate popup window */
item_spacing = ctx->style.window.spacing;
window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
max_height = count * item_height + count * (int)item_spacing.y;
max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
size.y = NK_MIN(size.y, (float)max_height);

item_getter(userdata, selected, &item);
if (nk_combo_begin_label(ctx, item, size)) {
nk_layout_row_dynamic(ctx, (float)item_height, 1);
for (i = 0; i < count; ++i) {
item_getter(userdata, i, &item);
if (nk_combo_item_label(ctx, item, NK_TEXT_LEFT))
selected = i;
}
nk_combo_end(ctx);
} return selected;
}